

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableGcCompactSettings(void)

{
  ImGuiContext_conflict *pIVar1;
  size_t sVar2;
  ImGuiTableSettings *__dest;
  ImGuiTableSettings *local_48;
  ImGuiTableSettings *settings_1;
  undefined1 local_30 [8];
  ImChunkStream<ImGuiTableSettings> new_chunk_stream;
  ImGuiTableSettings *settings;
  int required_memory;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  settings._4_4_ = 0;
  for (new_chunk_stream.Buf.Data =
            (char *)ImChunkStream<ImGuiTableSettings>::begin(&GImGui->SettingsTables);
      new_chunk_stream.Buf.Data != (char *)0x0;
      new_chunk_stream.Buf.Data =
           (char *)ImChunkStream<ImGuiTableSettings>::next_chunk
                             (&pIVar1->SettingsTables,
                              (ImGuiTableSettings *)new_chunk_stream.Buf.Data)) {
    if (*(int *)new_chunk_stream.Buf.Data != 0) {
      sVar2 = TableSettingsCalcChunkSize((int)new_chunk_stream.Buf.Data[0xc]);
      settings._4_4_ = (int)sVar2 + settings._4_4_;
    }
  }
  if (settings._4_4_ != (pIVar1->SettingsTables).Buf.Size) {
    ImChunkStream<ImGuiTableSettings>::ImChunkStream((ImChunkStream<ImGuiTableSettings> *)local_30);
    ImVector<char>::reserve((ImVector<char> *)local_30,settings._4_4_);
    for (local_48 = ImChunkStream<ImGuiTableSettings>::begin(&pIVar1->SettingsTables);
        local_48 != (ImGuiTableSettings *)0x0;
        local_48 = ImChunkStream<ImGuiTableSettings>::next_chunk(&pIVar1->SettingsTables,local_48))
    {
      if (local_48->ID != 0) {
        sVar2 = TableSettingsCalcChunkSize((int)local_48->ColumnsCount);
        __dest = ImChunkStream<ImGuiTableSettings>::alloc_chunk
                           ((ImChunkStream<ImGuiTableSettings> *)local_30,sVar2);
        sVar2 = TableSettingsCalcChunkSize((int)local_48->ColumnsCount);
        memcpy(__dest,local_48,sVar2);
      }
    }
    ImChunkStream<ImGuiTableSettings>::swap
              (&pIVar1->SettingsTables,(ImChunkStream<ImGuiTableSettings> *)local_30);
    ImChunkStream<ImGuiTableSettings>::~ImChunkStream((ImChunkStream<ImGuiTableSettings> *)local_30)
    ;
  }
  return;
}

Assistant:

void ImGui::TableGcCompactSettings()
{
    ImGuiContext& g = *GImGui;
    int required_memory = 0;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID != 0)
            required_memory += (int)TableSettingsCalcChunkSize(settings->ColumnsCount);
    if (required_memory == g.SettingsTables.Buf.Size)
        return;
    ImChunkStream<ImGuiTableSettings> new_chunk_stream;
    new_chunk_stream.Buf.reserve(required_memory);
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID != 0)
            memcpy(new_chunk_stream.alloc_chunk(TableSettingsCalcChunkSize(settings->ColumnsCount)), settings, TableSettingsCalcChunkSize(settings->ColumnsCount));
    g.SettingsTables.swap(new_chunk_stream);
}